

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O1

Result wallet::feebumper::CommitTransaction
                 (CWallet *wallet,uint256 *txid,CMutableTransaction *mtx,
                 vector<bilingual_str,_std::allocator<bilingual_str>_> *errors,uint256 *bumped_txid)

{
  CWalletTx *wtx;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Rb_tree_header *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  mapValue_t mapValue;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  orderForm;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var7;
  bool bVar8;
  Result RVar9;
  uint256 *puVar10;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var11;
  mapped_type *this;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  CTransactionRef tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  _Vector_impl_data in_stack_fffffffffffffe80;
  CTransaction *pCVar12;
  CTransaction *pCVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffeb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer ppVar14;
  long *local_138;
  long local_130;
  long local_128 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  key_type local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar14 = (pointer)&wallet->cs_wallet;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffeb8);
  RVar9 = MISC_ERROR;
  if ((errors->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (errors->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar10 = (uint256 *)
              std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (txid,txid + 1);
    if (puVar10 == txid + 1) {
      _Var11._M_cur = (__node_type *)0x0;
    }
    else {
      _Var11._M_cur =
           (__node_type *)
           std::
           _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(wallet->mapWallet)._M_h,txid);
    }
    if (_Var11._M_cur == (__node_type *)0x0) {
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Invalid or non-wallet transaction id","");
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_98,local_90 + (long)local_98);
      local_58._M_p = (pointer)&local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,local_98,local_90 + (long)local_98);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                (errors,(bilingual_str *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
    }
    else {
      wtx = (CWalletTx *)
            ((long)&((_Var11._M_cur)->
                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                    _M_storage._M_storage + 0x20);
      RVar9 = PreconditionChecks(wallet,wtx,false,errors);
      if (RVar9 == OK) {
        pCVar12 = (CTransaction *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffeb0,
                   (CTransaction **)&stack0xfffffffffffffea8,(allocator<CTransaction> *)local_78,mtx
                  );
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_c8,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)wtx);
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)local_78,
                   (void *)(*(long *)((long)&((_Var11._M_cur)->
                                             super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                             ._M_storage._M_storage + 0x1b8) + 0x39));
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"replaces_txid","");
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_c8,&local_e8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = local_78 + 0x10;
        if ((pointer)local_78._0_8_ != pcVar2) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
        if (in_stack_fffffffffffffeb0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
        {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (in_stack_fffffffffffffeb0._M_pi)->_M_use_count =
                 (in_stack_fffffffffffffeb0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (in_stack_fffffffffffffeb0._M_pi)->_M_use_count =
                 (in_stack_fffffffffffffeb0._M_pi)->_M_use_count + 1;
          }
        }
        p_Var1 = &local_118._M_impl.super__Rb_tree_header;
        if (local_c8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          p_Var7 = &local_118;
          local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_118._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_118._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        }
        else {
          p_Var3 = &local_c8._M_impl.super__Rb_tree_header;
          local_118._M_impl.super__Rb_tree_header._M_header._M_color =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_color;
          local_118._M_impl.super__Rb_tree_header._M_header._M_parent =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_118._M_impl.super__Rb_tree_header._M_header._M_left =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
          local_118._M_impl.super__Rb_tree_header._M_header._M_right =
               local_c8._M_impl.super__Rb_tree_header._M_header._M_right;
          (local_c8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               &p_Var1->_M_header;
          p_Var7 = &local_c8;
          local_118._M_impl.super__Rb_tree_header._M_node_count =
               local_c8._M_impl.super__Rb_tree_header._M_node_count;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
          local_c8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
        }
        (p_Var7->_M_impl).super__Rb_tree_header._M_node_count = 0;
        pCVar13 = pCVar12;
        this_00._M_pi = in_stack_fffffffffffffeb0._M_pi;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&stack0xfffffffffffffe80,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&((_Var11._M_cur)->
                            super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                            ._M_storage._M_storage + 0x50));
        mapValue._M_t._M_impl.super__Rb_tree_header._M_header._0_24_ = in_stack_fffffffffffffe80;
        mapValue._M_t._M_impl._0_8_ = bumped_txid;
        mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pCVar12;
        mapValue._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)in_stack_fffffffffffffeb0._M_pi;
        orderForm.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_00._M_pi;
        orderForm.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar13;
        orderForm.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar14;
        tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_118;
        tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&stack0xfffffffffffffe98;
        CWallet::CommitTransaction(wallet,tx_00,mapValue,orderForm);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&stack0xfffffffffffffe80);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_118);
        if ((pointer)in_stack_fffffffffffffeb0._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (in_stack_fffffffffffffeb0._M_pi);
        }
        uVar4 = *(undefined8 *)(pCVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar5 = *(undefined8 *)((pCVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
        ;
        uVar6 = *(undefined8 *)
                 ((pCVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)((bumped_txid->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((pCVar13->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
        ;
        *(undefined8 *)((bumped_txid->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar6;
        *(undefined8 *)(bumped_txid->super_base_blob<256U>).m_data._M_elems = uVar4;
        *(undefined8 *)((bumped_txid->super_base_blob<256U>).m_data._M_elems + 8) = uVar5;
        bVar8 = CWallet::MarkReplaced
                          (wallet,(uint256 *)
                                  (*(long *)((long)&((_Var11._M_cur)->
                                                                                                        
                                                  super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                                  ._M_storage._M_storage + 0x1b8) + 0x39),
                           bumped_txid);
        if (!bVar8) {
          local_138 = local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_138,
                     "Created new bumpfee transaction but could not mark the original transaction as replaced"
                     ,"");
          local_78._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_138,local_130 + (long)local_138);
          local_58._M_p = (pointer)&local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_138,local_130 + (long)local_138);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (errors,(bilingual_str *)local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_p != &local_48) {
            operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
          }
          if ((pointer)local_78._0_8_ != pcVar2) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          if (local_138 != local_128) {
            operator_delete(local_138,local_128[0] + 1);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_c8);
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        RVar9 = OK;
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar9;
  }
  __stack_chk_fail();
}

Assistant:

Result CommitTransaction(CWallet& wallet, const uint256& txid, CMutableTransaction&& mtx, std::vector<bilingual_str>& errors, uint256& bumped_txid)
{
    LOCK(wallet.cs_wallet);
    if (!errors.empty()) {
        return Result::MISC_ERROR;
    }
    auto it = txid.IsNull() ? wallet.mapWallet.end() : wallet.mapWallet.find(txid);
    if (it == wallet.mapWallet.end()) {
        errors.push_back(Untranslated("Invalid or non-wallet transaction id"));
        return Result::MISC_ERROR;
    }
    const CWalletTx& oldWtx = it->second;

    // make sure the transaction still has no descendants and hasn't been mined in the meantime
    Result result = PreconditionChecks(wallet, oldWtx, /* require_mine=*/ false, errors);
    if (result != Result::OK) {
        return result;
    }

    // commit/broadcast the tx
    CTransactionRef tx = MakeTransactionRef(std::move(mtx));
    mapValue_t mapValue = oldWtx.mapValue;
    mapValue["replaces_txid"] = oldWtx.GetHash().ToString();

    wallet.CommitTransaction(tx, std::move(mapValue), oldWtx.vOrderForm);

    // mark the original tx as bumped
    bumped_txid = tx->GetHash();
    if (!wallet.MarkReplaced(oldWtx.GetHash(), bumped_txid)) {
        errors.push_back(Untranslated("Created new bumpfee transaction but could not mark the original transaction as replaced"));
    }
    return Result::OK;
}